

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int main(int argc,char **argv)

{
  size_t len;
  char *pers;
  size_t sig_len;
  uchar sig [512];
  uchar hash [38];
  undefined1 local_828 [8];
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_ecdsa_context ctx_verify;
  mbedtls_ecdsa_context ctx_sign;
  int ret;
  char **argv_local;
  int argc_local;
  
  memcpy(sig + 0x1f8,"This should be the hash of a message.",0x26);
  mbedtls_ecdsa_init((mbedtls_ecdsa_context *)&ctx_verify.Q.Z.p);
  mbedtls_ecdsa_init((mbedtls_ecdsa_context *)&entropy.source[0x13].strong);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)local_828);
  memset(&sig_len,0,0x200);
  ctx_sign.Q.Z.p._4_4_ = 1;
  if (argc == 1) {
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
    len = strlen("ecdsa");
    ctx_sign.Q.Z.p._4_4_ =
         mbedtls_ctr_drbg_seed
                   ((mbedtls_ctr_drbg_context *)local_828,mbedtls_entropy_func,&ctr_drbg.p_entropy,
                    (uchar *)"ecdsa",len);
    if (ctx_sign.Q.Z.p._4_4_ == 0) {
      printf(" ok\n  . Generating key pair...");
      fflush(_stdout);
      ctx_sign.Q.Z.p._4_4_ =
           mbedtls_ecdsa_genkey
                     ((mbedtls_ecdsa_context *)&ctx_verify.Q.Z.p,MBEDTLS_ECP_DP_SECP192R1,
                      mbedtls_ctr_drbg_random,local_828);
      if (ctx_sign.Q.Z.p._4_4_ == 0) {
        printf(" ok (key size: %d bits)\n",(ulong)ctx_sign.grp.N.p & 0xffffffff);
        dump_pubkey("  + Public key: ",(mbedtls_ecdsa_context *)&ctx_verify.Q.Z.p);
        printf("  . Signing message...");
        fflush(_stdout);
        ctx_sign.Q.Z.p._4_4_ =
             mbedtls_ecdsa_write_signature
                       ((mbedtls_ecdsa_context *)&ctx_verify.Q.Z.p,MBEDTLS_MD_SHA256,sig + 0x1f8,
                        0x26,(uchar *)&sig_len,(size_t *)&pers,mbedtls_ctr_drbg_random,local_828);
        if (ctx_sign.Q.Z.p._4_4_ == 0) {
          printf(" ok (signature length = %u)\n",(ulong)pers & 0xffffffff);
          dump_buf("  + Hash: ",sig + 0x1f8,0x26);
          dump_buf("  + Signature: ",(uchar *)&sig_len,(size_t)pers);
          printf("  . Preparing verification context...");
          fflush(_stdout);
          ctx_sign.Q.Z.p._4_4_ =
               mbedtls_ecp_group_copy
                         ((mbedtls_ecp_group *)&entropy.source[0x13].strong,
                          (mbedtls_ecp_group *)&ctx_verify.Q.Z.p);
          if (ctx_sign.Q.Z.p._4_4_ == 0) {
            ctx_sign.Q.Z.p._4_4_ =
                 mbedtls_ecp_copy((mbedtls_ecp_point *)&ctx_verify.d.p,
                                  (mbedtls_ecp_point *)&ctx_sign.d.p);
            if (ctx_sign.Q.Z.p._4_4_ == 0) {
              ctx_sign.Q.Z.p._4_4_ = 0;
              printf(" ok\n  . Verifying signature...");
              fflush(_stdout);
              ctx_sign.Q.Z.p._4_4_ =
                   mbedtls_ecdsa_read_signature
                             ((mbedtls_ecdsa_context *)&entropy.source[0x13].strong,sig + 0x1f8,0x26
                              ,(uchar *)&sig_len,(size_t)pers);
              if (ctx_sign.Q.Z.p._4_4_ == 0) {
                printf(" ok\n");
              }
              else {
                printf(" failed\n  ! mbedtls_ecdsa_read_signature returned %d\n",
                       (ulong)ctx_sign.Q.Z.p._4_4_);
              }
            }
            else {
              printf(" failed\n  ! mbedtls_ecp_copy returned %d\n",(ulong)ctx_sign.Q.Z.p._4_4_);
            }
          }
          else {
            printf(" failed\n  ! mbedtls_ecp_group_copy returned %d\n",(ulong)ctx_sign.Q.Z.p._4_4_);
          }
        }
        else {
          printf(" failed\n  ! mbedtls_ecdsa_genkey returned %d\n",(ulong)ctx_sign.Q.Z.p._4_4_);
        }
      }
      else {
        printf(" failed\n  ! mbedtls_ecdsa_genkey returned %d\n",(ulong)ctx_sign.Q.Z.p._4_4_);
      }
    }
    else {
      printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)ctx_sign.Q.Z.p._4_4_);
    }
  }
  else {
    printf("usage: ecdsa\n");
  }
  mbedtls_ecdsa_free((mbedtls_ecdsa_context *)&entropy.source[0x13].strong);
  mbedtls_ecdsa_free((mbedtls_ecdsa_context *)&ctx_verify.Q.Z.p);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)local_828);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  return ctx_sign.Q.Z.p._4_4_;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret;
    mbedtls_ecdsa_context ctx_sign, ctx_verify;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char hash[] = "This should be the hash of a message.";
    unsigned char sig[512];
    size_t sig_len;
    const char *pers = "ecdsa";
    ((void) argv);

    mbedtls_ecdsa_init( &ctx_sign );
    mbedtls_ecdsa_init( &ctx_verify );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    memset(sig, 0, sizeof( sig ) );
    ret = 1;

    if( argc != 1 )
    {
        mbedtls_printf( "usage: ecdsa\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    /*
     * Generate a key pair for signing
     */
    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Generating key pair..." );
    fflush( stdout );

    if( ( ret = mbedtls_ecdsa_genkey( &ctx_sign, ECPARAMS,
                              mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdsa_genkey returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok (key size: %d bits)\n", (int) ctx_sign.grp.pbits );

    dump_pubkey( "  + Public key: ", &ctx_sign );

    /*
     * Sign some message hash
     */
    mbedtls_printf( "  . Signing message..." );
    fflush( stdout );

    if( ( ret = mbedtls_ecdsa_write_signature( &ctx_sign, MBEDTLS_MD_SHA256,
                                       hash, sizeof( hash ),
                                       sig, &sig_len,
                                       mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdsa_genkey returned %d\n", ret );
        goto exit;
    }
    mbedtls_printf( " ok (signature length = %u)\n", (unsigned int) sig_len );

    dump_buf( "  + Hash: ", hash, sizeof hash );
    dump_buf( "  + Signature: ", sig, sig_len );

    /*
     * Transfer public information to verifying context
     *
     * We could use the same context for verification and signatures, but we
     * chose to use a new one in order to make it clear that the verifying
     * context only needs the public key (Q), and not the private key (d).
     */
    mbedtls_printf( "  . Preparing verification context..." );
    fflush( stdout );

    if( ( ret = mbedtls_ecp_group_copy( &ctx_verify.grp, &ctx_sign.grp ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecp_group_copy returned %d\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_ecp_copy( &ctx_verify.Q, &ctx_sign.Q ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecp_copy returned %d\n", ret );
        goto exit;
    }

    ret = 0;

    /*
     * Verify signature
     */
    mbedtls_printf( " ok\n  . Verifying signature..." );
    fflush( stdout );

    if( ( ret = mbedtls_ecdsa_read_signature( &ctx_verify,
                                      hash, sizeof( hash ),
                                      sig, sig_len ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdsa_read_signature returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

exit:

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    mbedtls_ecdsa_free( &ctx_verify );
    mbedtls_ecdsa_free( &ctx_sign );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

    return( ret );
}